

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall Wasm::WasmBinaryReader::BrTableNode(WasmBinaryReader *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint32 *puVar6;
  WasmBinaryReader *this_01;
  ulong uVar7;
  uint32 local_2c [2];
  uint32 len;
  
  local_2c[0] = 0;
  this_01 = this;
  uVar3 = LEB128<unsigned_int,32u>(this,local_2c);
  (this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets = uVar3;
  if ((1000000 < uVar3) && (DAT_015932e2 == '\0')) {
    ThrowDecodingError(this_01,L"br_table too big");
  }
  puVar6 = &(this->m_funcState).count;
  *puVar6 = *puVar6 + local_2c[0];
  if ((ulong)uVar3 == 0) {
    puVar6 = (uint32 *)&DAT_00000008;
  }
  else {
    this_00 = &this->m_alloc->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00f1674a;
      *puVar5 = 0;
    }
    puVar6 = (uint32 *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(this_00,(ulong)uVar3 << 2);
    if (puVar6 == (uint32 *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00f1674a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      puVar6 = (uint32 *)0x0;
    }
  }
  (this->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable = puVar6;
  if ((this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets != 0) {
    uVar7 = 0;
    do {
      uVar3 = LEB128<unsigned_int,32u>(this,local_2c);
      (this->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable[uVar7] = uVar3;
      puVar6 = &(this->m_funcState).count;
      *puVar6 = *puVar6 + local_2c[0];
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets);
  }
  uVar3 = LEB128<unsigned_int,32u>(this,local_2c);
  (this->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget = uVar3;
  puVar6 = &(this->m_funcState).count;
  *puVar6 = *puVar6 + local_2c[0];
  return;
}

Assistant:

void WasmBinaryReader::BrTableNode()
{
    uint32 len = 0;
    m_currentNode.brTable.numTargets = LEB128(len);
    if (m_currentNode.brTable.numTargets > Limits::GetMaxBrTableElems())
    {
        ThrowDecodingError(_u("br_table too big"));
    }
    m_funcState.count += len;
    m_currentNode.brTable.targetTable = AnewArray(m_alloc, uint32, m_currentNode.brTable.numTargets);

    for (uint32 i = 0; i < m_currentNode.brTable.numTargets; i++)
    {
        m_currentNode.brTable.targetTable[i] = LEB128(len);
        m_funcState.count += len;
    }
    m_currentNode.brTable.defaultTarget = LEB128(len);
    m_funcState.count += len;
}